

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

SPIRExpression * __thiscall
spirv_cross::CompilerGLSL::emit_uninitialized_temporary_expression
          (CompilerGLSL *this,uint32_t type,uint32_t id)

{
  uint32_t id_00;
  SPIRExpression *pSVar1;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar2;
  bool local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  _Node_iterator_base<unsigned_int,_false> local_28;
  undefined1 local_20;
  uint32_t local_18;
  uint32_t local_14;
  uint32_t id_local;
  uint32_t type_local;
  CompilerGLSL *this_local;
  
  local_18 = id;
  local_14 = type;
  _id_local = this;
  pVar2 = ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::insert(&(this->super_Compiler).forced_temporaries,&local_18);
  local_28._M_cur = (__node_type *)pVar2.first.super__Node_iterator_base<unsigned_int,_false>._M_cur
  ;
  local_20 = pVar2.second;
  emit_uninitialized_temporary(this,local_14,local_18);
  id_00 = local_18;
  (*(this->super_Compiler)._vptr_Compiler[6])();
  local_49 = true;
  pSVar1 = Compiler::set<spirv_cross::SPIRExpression,std::__cxx11::string,unsigned_int&,bool>
                     (&this->super_Compiler,id_00,&local_48,&local_14,&local_49);
  ::std::__cxx11::string::~string((string *)&local_48);
  return pSVar1;
}

Assistant:

SPIRExpression &CompilerGLSL::emit_uninitialized_temporary_expression(uint32_t type, uint32_t id)
{
	forced_temporaries.insert(id);
	emit_uninitialized_temporary(type, id);
	return set<SPIRExpression>(id, to_name(id), type, true);
}